

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

void __thiscall
QGestureManager::cleanupGesturesForRemovedRecognizer(QGestureManager *this,QGesture *gesture)

{
  byte bVar1;
  QHash<QGesture_*,_QGestureRecognizer_*> *in_RDI;
  long in_FS_OFFSET;
  QGestureRecognizer *recognizer;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QHash<QGesture_*,_QGestureRecognizer_*> *key;
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *in_stack_ffffffffffffffc8;
  QHash<QGesture_*,_QGestureRecognizer_*> *in_stack_ffffffffffffffd0;
  QGestureRecognizer *local_18;
  char local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  local_18 = QHash<QGesture_*,_QGestureRecognizer_*>::value
                       (in_RDI,(QGesture **)
                               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (local_18 != (QGestureRecognizer *)0x0) {
    QHash<QGesture_*,_QGestureRecognizer_*>::remove(in_RDI + 0xb,local_10);
    QHash<QGesture_*,_QGestureRecognizer_*>::keys
              (in_stack_ffffffffffffffd0,(QGestureRecognizer **)in_stack_ffffffffffffffc8);
    bVar1 = QList<QGesture_*>::isEmpty((QList<QGesture_*> *)0x30a2ef);
    QList<QGesture_*>::~QList((QList<QGesture_*> *)0x30a2fd);
    if ((bVar1 & 1) != 0) {
      QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::value
                (in_stack_ffffffffffffffc8,(QGestureRecognizer **)key);
      qDeleteAll<QSet<QGesture*>>((QSet<QGesture_*> *)in_RDI);
      QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x30a333);
      QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::remove
                ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)(in_RDI + 10),(char *)&local_18);
      if (local_18 != (QGestureRecognizer *)0x0) {
        (*local_18->_vptr_QGestureRecognizer[1])();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGestureManager::cleanupGesturesForRemovedRecognizer(QGesture *gesture)
{
    QGestureRecognizer *recognizer = m_deletedRecognizers.value(gesture);
    if (!recognizer) //The Gesture is removed while in the even loop, so the recognizers for this gestures was removed
        return;
    m_deletedRecognizers.remove(gesture);
    if (m_deletedRecognizers.keys(recognizer).isEmpty()) {
        // no more active gestures, cleanup!
        qDeleteAll(m_obsoleteGestures.value(recognizer));
        m_obsoleteGestures.remove(recognizer);
        delete recognizer;
    }
}